

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::detail::scoped_dfs_traverser::scoped_dfs_traverser(scoped_dfs_traverser *this,group *g)

{
  group *g_local;
  scoped_dfs_traverser *this_local;
  
  group::depth_first_traverser::depth_first_traverser(&this->pos_,g);
  (this->lastMatch_).stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lastMatch_).stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lastMatch_).stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  group::depth_first_traverser::depth_first_traverser(&this->lastMatch_);
  (this->posAfterLastMatch_).stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->posAfterLastMatch_).stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->posAfterLastMatch_).stack_.
  super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  group::depth_first_traverser::depth_first_traverser(&this->posAfterLastMatch_);
  std::
  stack<clipp::group::depth_first_traverser::memento,std::deque<clipp::group::depth_first_traverser::memento,std::allocator<clipp::group::depth_first_traverser::memento>>>
  ::
  stack<std::deque<clipp::group::depth_first_traverser::memento,std::allocator<clipp::group::depth_first_traverser::memento>>,void>
            ((stack<clipp::group::depth_first_traverser::memento,std::deque<clipp::group::depth_first_traverser::memento,std::allocator<clipp::group::depth_first_traverser::memento>>>
              *)&this->scopes_);
  this->ignoreBlocks_ = false;
  this->repeatGroupStarted_ = false;
  this->repeatGroupContinues_ = false;
  return;
}

Assistant:

explicit
    scoped_dfs_traverser(const group& g):
        pos_{g}, lastMatch_{}, posAfterLastMatch_{}, scopes_{},
        ignoreBlocks_{false},
        repeatGroupStarted_{false}, repeatGroupContinues_{false}
    {}